

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O0

int parsehex(char c)

{
  char c_local;
  undefined4 local_4;
  
  if ((c < '0') || ('9' < c)) {
    if ((c < 'a') || ('f' < c)) {
      if ((c < 'A') || ('F' < c)) {
        local_4 = -1;
      }
      else {
        local_4 = c + -0x41;
      }
    }
    else {
      local_4 = c + -0x61;
    }
  }
  else {
    local_4 = c + -0x30;
  }
  return local_4;
}

Assistant:

static int
parsehex(char c)
{
	if (c >= '0' && c <= '9')
		return c - '0';
	else if (c >= 'a' && c <= 'f')
		return c - 'a';
	else if (c >= 'A' && c <= 'F')
		return c - 'A';
	else
		return -1;
}